

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O2

bool P_NoWayTraverse(AActor *usething,DVector2 *start,DVector2 *end)

{
  double dVar1;
  line_t_conflict *this;
  bool bVar2;
  intercept_t *piVar3;
  DVector2 local_118;
  FPathTraverse it;
  FLineOpening open;
  
  FPathTraverse::FPathTraverse(&it,start->X,start->Y,end->X,end->Y,1,0.0);
  while( true ) {
    do {
      piVar3 = FPathTraverse::Next(&it);
      if (piVar3 == (intercept_t *)0x0) {
        bVar2 = false;
        goto LAB_0041b199;
      }
      this = (piVar3->d).line;
    } while (this->special != 0);
    bVar2 = line_t::isLinePortal((line_t *)this);
    if ((bVar2) || ((this->flags & 0xc001) != 0)) break;
    local_118.X = piVar3->frac * it.trace.dx + it.trace.x;
    local_118.Y = piVar3->frac * it.trace.dy + it.trace.y;
    P_LineOpening(&open,(AActor *)0x0,(line_t *)this,&local_118,(DVector2 *)0x0,0);
    if ((open.range <= 0.0) ||
       ((dVar1 = (usething->__Pos).Z, usething->MaxStepHeight + dVar1 < open.bottom ||
        (open.top < dVar1 + usething->Height)))) break;
  }
  bVar2 = !bVar2;
LAB_0041b199:
  FPathTraverse::~FPathTraverse(&it);
  return bVar2;
}

Assistant:

bool P_NoWayTraverse(AActor *usething, const DVector2 &start, const DVector2 &end)
{
	FPathTraverse it(start.X, start.Y, end.X, end.Y, PT_ADDLINES);
	intercept_t *in;

	while ((in = it.Next()))
	{
		line_t *ld = in->d.line;
		FLineOpening open;

		// [GrafZahl] de-obfuscated. Was I the only one who was unable to make sense out of
		// this convoluted mess?
		if (ld->special) continue;
		if (ld->isLinePortal()) return false;
		if (ld->flags&(ML_BLOCKING | ML_BLOCKEVERYTHING | ML_BLOCK_PLAYERS)) return true;
		P_LineOpening(open, NULL, ld, it.InterceptPoint(in));
		if (open.range <= 0 ||
			open.bottom > usething->Z() + usething->MaxStepHeight ||
			open.top < usething->Top()) return true;
	}
	return false;
}